

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgelement.cpp
# Opt level: O3

Rect __thiscall lunasvg::SVGElement::paintBoundingBox(SVGElement *this)

{
  Rect *this_00;
  float fVar1;
  float fVar2;
  float extraout_XMM0_Da;
  float extraout_XMM0_Db;
  undefined8 uVar3;
  Rect RVar4;
  Rect local_20;
  
  uVar3 = 0;
  if (((this->m_paintBoundingBox).w < 0.0) || ((this->m_paintBoundingBox).h < 0.0)) {
    this_00 = &this->m_paintBoundingBox;
    this_00->x = 0.0;
    (this->m_paintBoundingBox).y = 0.0;
    (this->m_paintBoundingBox).w = 0.0;
    (this->m_paintBoundingBox).h = 0.0;
    (*(this->super_SVGNode)._vptr_SVGNode[0xc])(this);
    fVar1 = (float)((ulong)uVar3 >> 0x20);
    (this->m_paintBoundingBox).x = extraout_XMM0_Da;
    (this->m_paintBoundingBox).y = extraout_XMM0_Db;
    (this->m_paintBoundingBox).w = (float)uVar3;
    (this->m_paintBoundingBox).h = fVar1;
    if (((float)uVar3 < 0.0) || (fVar1 < 0.0)) {
      __assert_fail("m_paintBoundingBox.isValid()",
                    "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/source/svgelement.cpp"
                    ,0x141,"virtual Rect lunasvg::SVGElement::paintBoundingBox() const");
    }
    fVar1 = extraout_XMM0_Da;
    fVar2 = extraout_XMM0_Db;
    if (this->m_clipper != (SVGClipPathElement *)0x0) {
      local_20 = SVGClipPathElement::clipBoundingBox(this->m_clipper,this);
      RVar4 = Rect::intersected(this_00,&local_20);
      uVar3 = RVar4._8_8_;
      fVar1 = RVar4.x;
      fVar2 = RVar4.y;
      this->m_paintBoundingBox = RVar4;
    }
    if (this->m_masker != (SVGMaskElement *)0x0) {
      local_20 = SVGMaskElement::maskBoundingBox(this->m_masker,this);
      RVar4 = Rect::intersected(this_00,&local_20);
      uVar3 = RVar4._8_8_;
      fVar1 = RVar4.x;
      fVar2 = RVar4.y;
      this->m_paintBoundingBox = RVar4;
    }
  }
  else {
    fVar1 = (this->m_paintBoundingBox).x;
    fVar2 = (this->m_paintBoundingBox).y;
    uVar3._0_4_ = (this->m_paintBoundingBox).w;
    uVar3._4_4_ = (this->m_paintBoundingBox).h;
  }
  RVar4.y = fVar2;
  RVar4.x = fVar1;
  RVar4.w = (float)(int)uVar3;
  RVar4.h = (float)(int)((ulong)uVar3 >> 0x20);
  return RVar4;
}

Assistant:

Rect SVGElement::paintBoundingBox() const
{
    if(m_paintBoundingBox.isValid())
        return m_paintBoundingBox;
    m_paintBoundingBox = Rect::Empty;
    m_paintBoundingBox = strokeBoundingBox();
    assert(m_paintBoundingBox.isValid());
    if(m_clipper) m_paintBoundingBox.intersect(m_clipper->clipBoundingBox(this));
    if(m_masker) m_paintBoundingBox.intersect(m_masker->maskBoundingBox(this));
    return m_paintBoundingBox;
}